

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O3

FT_Error tt_sbit_decoder_load_bit_aligned
                   (TT_SBitDecoder decoder,FT_Byte *p,FT_Byte *limit,FT_Int x_pos,FT_Int y_pos,
                   FT_UInt recurse_count)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  FT_Bitmap *pFVar4;
  bool bVar5;
  uint uVar6;
  FT_Error FVar7;
  FT_Error FVar8;
  byte bVar9;
  byte *pbVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  byte *pbVar16;
  uint uVar17;
  uint uVar18;
  
  FVar7 = 3;
  FVar8 = 3;
  if ((-1 < x_pos) && (-1 < y_pos)) {
    pFVar4 = decoder->bitmap;
    uVar15 = (uint)decoder->metrics->width;
    FVar8 = FVar7;
    if ((uVar15 + x_pos <= pFVar4->width) &&
       (uVar2 = decoder->metrics->height, (uint)uVar2 + y_pos <= pFVar4->rows)) {
      uVar15 = decoder->bit_depth * uVar15;
      if (p + (uVar15 * uVar2 + 7 >> 3) <= limit) {
        if (uVar2 != 0 && uVar15 != 0) {
          iVar3 = pFVar4->pitch;
          pbVar10 = pFVar4->buffer + (int)(((uint)x_pos >> 3) + y_pos * iVar3);
          uVar12 = x_pos & 7;
          uVar6 = 8 - uVar12;
          if (uVar15 < 8 - uVar12) {
            uVar6 = uVar15;
          }
          uVar14 = 0;
          uVar11 = 0;
          uVar13 = (uint)uVar2;
          do {
            pbVar16 = pbVar10;
            uVar17 = uVar15;
            if (uVar12 != 0) {
              if (uVar13 == uVar2) {
                uVar14 = (uint)*p;
                p = p + 1;
                uVar11 = uVar12;
              }
              else if ((int)uVar11 < (int)uVar6) {
                if (p < limit) {
                  bVar9 = *p;
                  p = p + 1;
                  uVar14 = uVar14 | bVar9;
                }
                uVar11 = (uVar11 - uVar6) + 8;
              }
              else {
                uVar14 = (uVar14 & 0xffff) >> 8;
                uVar11 = uVar11 - uVar6;
              }
              *pbVar10 = *pbVar10 |
                         (byte)((uVar14 & 0xffff) >> ((byte)uVar11 & 0x1f)) &
                         (byte)(~(0xff << ((byte)uVar6 & 0x1f)) <<
                               (8 - ((char)uVar12 + (byte)uVar6) & 0x1f));
              uVar14 = uVar14 << 8;
              pbVar16 = pbVar10 + 1;
              uVar17 = uVar15 - uVar6;
            }
            bVar9 = (byte)uVar11;
            uVar18 = uVar17;
            if (7 < (int)uVar17) {
              do {
                bVar1 = *p;
                p = p + 1;
                uVar14 = uVar14 & 0xffff | (uint)bVar1;
                *pbVar16 = *pbVar16 | (byte)(uVar14 >> (bVar9 & 0x1f));
                pbVar16 = pbVar16 + 1;
                uVar14 = uVar14 << 8;
                uVar17 = uVar18 - 8;
                bVar5 = 0xf < uVar18;
                uVar18 = uVar17;
              } while (bVar5);
            }
            if (0 < (int)uVar17) {
              if ((int)uVar11 < (int)uVar17) {
                if (p < limit) {
                  bVar1 = *p;
                  p = p + 1;
                  uVar14 = uVar14 | bVar1;
                }
                *pbVar16 = *pbVar16 |
                           (byte)(0xff00 >> ((byte)uVar17 & 0x1f)) &
                           (byte)((uVar14 & 0xffff) >> (bVar9 & 0x1f));
                uVar11 = (uVar11 - uVar17) + 8;
                uVar14 = uVar14 << 8;
              }
              else {
                *pbVar16 = *pbVar16 |
                           (byte)(0xff00 >> ((byte)uVar17 & 0x1f)) &
                           (byte)((uVar14 & 0xffff) >> (bVar9 & 0x1f));
                uVar11 = uVar11 - uVar17;
              }
            }
            pbVar10 = pbVar10 + iVar3;
            bVar5 = 1 < (int)uVar13;
            uVar13 = uVar13 - 1;
          } while (bVar5);
        }
        FVar8 = 0;
      }
    }
  }
  return FVar8;
}

Assistant:

static FT_Error
  tt_sbit_decoder_load_bit_aligned( TT_SBitDecoder  decoder,
                                    FT_Byte*        p,
                                    FT_Byte*        limit,
                                    FT_Int          x_pos,
                                    FT_Int          y_pos,
                                    FT_UInt         recurse_count )
  {
    FT_Error    error = FT_Err_Ok;
    FT_Byte*    line;
    FT_Int      pitch, width, height, line_bits, h, nbits;
    FT_UInt     bit_height, bit_width;
    FT_Bitmap*  bitmap;
    FT_UShort   rval;

    FT_UNUSED( recurse_count );


    /* check that we can write the glyph into the bitmap */
    bitmap     = decoder->bitmap;
    bit_width  = bitmap->width;
    bit_height = bitmap->rows;
    pitch      = bitmap->pitch;
    line       = bitmap->buffer;

    width  = decoder->metrics->width;
    height = decoder->metrics->height;

    line_bits = width * decoder->bit_depth;

    if ( x_pos < 0 || (FT_UInt)( x_pos + width ) > bit_width   ||
         y_pos < 0 || (FT_UInt)( y_pos + height ) > bit_height )
    {
      FT_TRACE1(( "tt_sbit_decoder_load_bit_aligned:"
                  " invalid bitmap dimensions\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( p + ( ( line_bits * height + 7 ) >> 3 ) > limit )
    {
      FT_TRACE1(( "tt_sbit_decoder_load_bit_aligned: broken bitmap\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( !line_bits || !height )
    {
      /* nothing to do */
      goto Exit;
    }

    /* now do the blit */

    /* adjust `line' to point to the first byte of the bitmap */
    line  += y_pos * pitch + ( x_pos >> 3 );
    x_pos &= 7;

    /* the higher byte of `rval' is used as a buffer */
    rval  = 0;
    nbits = 0;

    for ( h = height; h > 0; h--, line += pitch )
    {
      FT_Byte*  pwrite = line;
      FT_Int    w      = line_bits;


      /* handle initial byte (in target bitmap) specially if necessary */
      if ( x_pos )
      {
        w = ( line_bits < 8 - x_pos ) ? line_bits : 8 - x_pos;

        if ( h == height )
        {
          rval  = *p++;
          nbits = x_pos;
        }
        else if ( nbits < w )
        {
          if ( p < limit )
            rval |= *p++;
          nbits += 8 - w;
        }
        else
        {
          rval  >>= 8;
          nbits  -= w;
        }

        *pwrite++ |= ( ( rval >> nbits ) & 0xFF ) &
                     ( ~( 0xFFU << w ) << ( 8 - w - x_pos ) );
        rval     <<= 8;

        w = line_bits - w;
      }

      /* handle medial bytes */
      for ( ; w >= 8; w -= 8 )
      {
        rval      |= *p++;
        *pwrite++ |= ( rval >> nbits ) & 0xFF;

        rval <<= 8;
      }

      /* handle final byte if necessary */
      if ( w > 0 )
      {
        if ( nbits < w )
        {
          if ( p < limit )
            rval |= *p++;
          *pwrite |= ( ( rval >> nbits ) & 0xFF ) & ( 0xFF00U >> w );
          nbits   += 8 - w;

          rval <<= 8;
        }
        else
        {
          *pwrite |= ( ( rval >> nbits ) & 0xFF ) & ( 0xFF00U >> w );
          nbits   -= w;
        }
      }
    }

  Exit:
    if ( !error )
      FT_TRACE3(( "tt_sbit_decoder_load_bit_aligned: loaded\n" ));
    return error;
  }